

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O2

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  int iVar1;
  pointer pvVar2;
  pointer pPVar3;
  Sym LHS;
  pointer piVar4;
  pointer piVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> pi;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> r;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  new_non_terminals;
  TermFactory local_138;
  CycleBreaking<covenant::Sym> *local_128;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_120;
  Rule local_118;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_f0;
  _Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_> local_d8;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  local_c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  local_60;
  
  if ((long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    local_128 = this;
    local_120 = &group_set->_M_t;
    boost::unordered::
    unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
    ::unordered_map((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                     *)&local_c0);
    uVar6 = 0;
    while( true ) {
      piVar4 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)((long)piVar5 - (long)piVar4 >> 2) <= (ulong)uVar6) break;
      LHS = CFG::newVar(g);
      local_138.px = (g->_tfac).px;
      local_138.pn.pi_ = (g->_tfac).pn.pi_;
      if (local_138.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_138.pn.pi_)->use_count_ = (local_138.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      Rule::E(&local_118,&local_138);
      CFG::prod(g,LHS,&local_118);
      Rule::~Rule(&local_118);
      boost::detail::shared_count::~shared_count(&local_138.pn);
      local_118._tfac.px =
           (element_type *)
           CONCAT44(LHS.x,(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar6]);
      boost::unordered::
      unordered_map<int,covenant::Sym,boost::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,covenant::Sym>>>
      ::emplace<std::pair<int,covenant::Sym>>
                ((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                  *)&local_c0,(pair<int,_covenant::Sym> *)&local_118);
      uVar6 = uVar6 + 1;
    }
    for (uVar6 = 0; uVar7 = (ulong)uVar6, uVar7 < (ulong)((long)piVar5 - (long)piVar4 >> 2);
        uVar6 = uVar6 + 1) {
      std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::vector
                ((vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *)
                 &local_118,
                 (g->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + piVar4[uVar7]);
      iVar1 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start[uVar7];
      pvVar2 = (g->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar3 = pvVar2[iVar1].
               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[iVar1].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data + 8) != pPVar3) {
        *(pointer *)
         ((long)&pvVar2[iVar1].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data + 8) = pPVar3;
      }
      uVar8 = 0;
      while( true ) {
        if ((ulong)((long)local_118._tfac.pn.pi_ - (long)local_118._tfac.px >> 2) <= (ulong)uVar8)
        break;
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_f0,
                   (g->rules).
                   super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   *(int *)((long)&(local_118._tfac.px)->_next_id + (ulong)uVar8 * 4));
        iVar1 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_d8,
                   (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_f0);
        boost::unordered::
        unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
        ::unordered_map((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                         *)&local_60,
                        (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                         *)&local_c0);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  (&local_90,local_120);
        cycle_breaking_transf_rule
                  (local_128,g,iVar1,
                   (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)&local_d8,
                   (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                    *)&local_60,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_90);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_90);
        boost::unordered::detail::
        table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
        ::~table(&local_60);
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_d8);
        std::_Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>::~_Vector_base(&local_f0);
        uVar8 = uVar8 + 1;
      }
      std::_Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
      ~_Vector_base((_Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                     *)&local_118);
      piVar4 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
    ::~table(&local_c0);
  }
  return;
}

Assistant:

void  cycle_breaking_transf (CFG &g, 
                               const vector<int> &group, 
                               const set<int> &group_set)
  {
    if (group.size() == 1) return;

    boost::unordered_map<int, EdgeSym> new_non_terminals;
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      // add epsilon productions
      EdgeSym A( g.newVar () );
      g.prod(A, Rule::E (g.getTermFactory ()));
      new_non_terminals.insert(make_pair(group[nt], A));
      // LOG ("abstraction" , 
      //      cout << "Added " << A << " -> e " <<  " from " 
      //           << EdgeSym::mkVar(group[nt]) << "\n");
           
    }
    // iterate over each nonterminal in the mutually recursive group 
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      vector<CFG::ProdInfo> pi(g.prods[group[nt]]);
      g.prods[group[nt]].clear();
      // iterate over each rule in the production

      // LOG ("abstraction", 
      //      cout << "Production: "; g.printProduction(cout, group[nt]); cout << endl);

      for( unsigned int ri = 0; ri < pi.size(); ri++ )
      {
        vector<EdgeSym> r(g.rules[pi[ri].rule]);

        // LOG("abstraction", 
        //     cout << "\tRule: "; Rule(r, g.getTermFactory ()); cout << endl);

        cycle_breaking_transf_rule(g, 
                                   group[nt], 
                                   r, 
                                   new_non_terminals, 
                                   group_set);
      }
    }
  }